

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bool.cpp
# Opt level: O1

void __thiscall Bool::display(Bool *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cited: ",7);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"type : bool",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value: ",7);
  (*(this->super_Data)._vptr_Data[2])(this);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return;
}

Assistant:

void Bool::display() {
    std::cout << "cited: " << cited << std::endl;
    std::cout << "type : bool" << std::endl;
    std::cout << "value: ";
    print();
    std::cout << std::endl;
    std::cout << std::endl;
}